

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.cpp
# Opt level: O3

char * mz_error(int err)

{
  long lVar1;
  
  lVar1 = 8;
  do {
    if (*(int *)((long)&PTR_typeinfo_name_001b18a8 + lVar1) == err) {
      return *(char **)((long)&mz_error::s_error_descs[0].m_err + lVar1);
    }
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0xa8);
  return (char *)0x0;
}

Assistant:

const char *mz_error(int err)
{
    static struct
    {
        int m_err;
        const char *m_pDesc;
    } s_error_descs[] = {{MZ_OK, ""},
                         {MZ_STREAM_END, "stream end"},
                         {MZ_NEED_DICT, "need dictionary"},
                         {MZ_ERRNO, "file error"},
                         {MZ_STREAM_ERROR, "stream error"},
                         {MZ_DATA_ERROR, "data error"},
                         {MZ_MEM_ERROR, "out of memory"},
                         {MZ_BUF_ERROR, "buf error"},
                         {MZ_VERSION_ERROR, "version error"},
                         {MZ_PARAM_ERROR, "parameter error"}};
    mz_uint i;
    for (i = 0; i < sizeof(s_error_descs) / sizeof(s_error_descs[0]); ++i)
        if (s_error_descs[i].m_err == err)
            return s_error_descs[i].m_pDesc;
    return NULL;
}